

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void tinygltf::SerializeGltfAccessor(Accessor *accessor,json *o)

{
  number_integer_t nVar1;
  char cVar2;
  ulong uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  allocator local_269;
  string local_268;
  allocator local_241;
  string local_240;
  allocator local_219;
  string local_218;
  undefined1 local_1f8 [8];
  string type;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  json *local_18;
  json *o_local;
  Accessor *accessor_local;
  
  local_18 = o;
  o_local = (json *)accessor;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"bufferView",&local_39);
  SerializeNumberProperty<int>(&local_38,*(int *)o_local,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  nVar1 = o_local[2].m_value.number_integer;
  auVar5._8_4_ = (int)((ulong)nVar1 >> 0x20);
  auVar5._0_8_ = nVar1;
  auVar5._12_4_ = 0x45300000;
  dVar4 = (auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)nVar1) - 4503599627370496.0);
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"byteOffset",&local_71);
    SerializeNumberProperty<int>(&local_70,*(int *)&o_local[2].m_value,local_18);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"componentType",&local_99);
  SerializeNumberProperty<int>(&local_98,*(int *)&o_local[3].field_0x4,local_18);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"count",&local_c1);
  SerializeNumberProperty<unsigned_long>(&local_c0,o_local[3].m_value.number_unsigned,local_18);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"min",&local_e9);
  SerializeNumberArrayProperty<double>
            (&local_e8,(vector<double,_std::allocator<double>_> *)(o_local + 0xe),local_18);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"max",&local_111);
  SerializeNumberArrayProperty<double>
            (&local_110,(vector<double,_std::allocator<double>_> *)&o_local[0xf].m_value,local_18);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"normalized",&local_139);
  Value::Value((Value *)((long)&type.field_2 + 8),(bool)(o_local[3].m_type & object));
  SerializeValue(&local_138,(Value *)((long)&type.field_2 + 8),local_18);
  Value::~Value((Value *)((long)&type.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::__cxx11::string::string((string *)local_1f8);
  switch(*(undefined4 *)(o_local + 4)) {
  case 2:
    std::__cxx11::string::operator=((string *)local_1f8,"VEC2");
    break;
  case 3:
    std::__cxx11::string::operator=((string *)local_1f8,"VEC3");
    break;
  case 4:
    std::__cxx11::string::operator=((string *)local_1f8,"VEC4");
    break;
  case 0x22:
    std::__cxx11::string::operator=((string *)local_1f8,"MAT2");
    break;
  case 0x23:
    std::__cxx11::string::operator=((string *)local_1f8,"MAT3");
    break;
  case 0x24:
    std::__cxx11::string::operator=((string *)local_1f8,"MAT4");
    break;
  case 0x41:
    std::__cxx11::string::operator=((string *)local_1f8,"SCALAR");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_218,"type",&local_219);
  SerializeStringProperty(&local_218,(string *)local_1f8,local_18);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_240,"name",&local_241);
    SerializeStringProperty(&local_240,(string *)&o_local->m_value,local_18);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
  }
  cVar2 = Value::Type((Value *)&o_local[4].m_value);
  if (cVar2 != '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_268,"extras",&local_269);
    SerializeValue(&local_268,(Value *)&o_local[4].m_value,local_18);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
  }
  std::__cxx11::string::~string((string *)local_1f8);
  return;
}

Assistant:

static void SerializeGltfAccessor(Accessor &accessor, json &o) {
  SerializeNumberProperty<int>("bufferView", accessor.bufferView, o);

  if (accessor.byteOffset != 0.0)
    SerializeNumberProperty<int>("byteOffset", int(accessor.byteOffset), o);

  SerializeNumberProperty<int>("componentType", accessor.componentType, o);
  SerializeNumberProperty<size_t>("count", accessor.count, o);
  SerializeNumberArrayProperty<double>("min", accessor.minValues, o);
  SerializeNumberArrayProperty<double>("max", accessor.maxValues, o);
  SerializeValue("normalized", Value(accessor.normalized), o);
  std::string type;
  switch (accessor.type) {
    case TINYGLTF_TYPE_SCALAR:
      type = "SCALAR";
      break;
    case TINYGLTF_TYPE_VEC2:
      type = "VEC2";
      break;
    case TINYGLTF_TYPE_VEC3:
      type = "VEC3";
      break;
    case TINYGLTF_TYPE_VEC4:
      type = "VEC4";
      break;
    case TINYGLTF_TYPE_MAT2:
      type = "MAT2";
      break;
    case TINYGLTF_TYPE_MAT3:
      type = "MAT3";
      break;
    case TINYGLTF_TYPE_MAT4:
      type = "MAT4";
      break;
  }

  SerializeStringProperty("type", type, o);
  if (!accessor.name.empty()) SerializeStringProperty("name", accessor.name, o);

  if (accessor.extras.Type() != NULL_TYPE) {
    SerializeValue("extras", accessor.extras, o);
  }
}